

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lejp-conf.c
# Opt level: O3

int lwsws_get_config_globals(lws_context_creation_info *info,char *d,char **cs,int *len)

{
  char **ppcVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  lws_dir_args da;
  char dd [128];
  lws_context_creation_info *local_1b8;
  undefined1 local_1b0 [32];
  char *local_190;
  char *local_188;
  char **local_e8;
  int local_e0;
  undefined1 local_dc;
  lws_context_creation_info **local_d8;
  char **local_d0;
  undefined4 local_c8;
  code *local_c0;
  char local_b8 [136];
  
  ppcVar1 = info->plugin_dirs;
  lVar8 = 0;
  memset(local_1b0,0,0xd8);
  local_190 = *cs;
  uVar4 = (ulong)((uint)local_190 & 0xf);
  lVar6 = 0x10 - uVar4;
  if (uVar4 == 0) {
    lVar6 = 0;
  }
  local_188 = local_190 + (long)*len + -1;
  local_e8 = (char **)(local_190 + lVar6);
  local_dc = 0;
  info->plugin_dirs = local_e8;
  local_190 = local_190 + lVar6 + 0x50;
  if (ppcVar1 != (char **)0x0) {
    pcVar5 = *ppcVar1;
    if (pcVar5 != (char *)0x0) {
      lVar8 = 0;
      do {
        local_e8[lVar8] = pcVar5;
        pcVar5 = ppcVar1[lVar8 + 1];
        lVar8 = lVar8 + 1;
      } while (pcVar5 != (char *)0x0);
    }
    local_e0 = (int)lVar8;
  }
  local_1b8 = info;
  lws_snprintf(local_b8,0x7f,"%s/conf",d);
  uVar2 = lwsws_get_config(&local_1b8,local_b8,paths_global,0xf,lejp_globals_cb);
  iVar7 = 1;
  if (uVar2 < 2) {
    lws_snprintf(local_b8,0x7f,"%s/conf.d",d);
    local_d0 = paths_global;
    local_c8 = 0xf;
    local_c0 = lejp_globals_cb;
    local_d8 = &local_1b8;
    iVar3 = lws_dir(local_b8,&local_d8,lwsws_get_config_d_cb);
    if (iVar3 < 2) {
      local_e8[local_e0] = (char *)0x0;
      *cs = local_190;
      *len = (int)local_188 - (int)local_190;
      iVar7 = 0;
    }
  }
  return iVar7;
}

Assistant:

int
lwsws_get_config_globals(struct lws_context_creation_info *info, const char *d,
			 char **cs, int *len)
{
	struct lws_dir_args da;
	struct jpargs a;
	const char * const *old = info->plugin_dirs;
	char dd[128];

	memset(&a, 0, sizeof(a));

	a.info = info;
	a.p = *cs;
	a.end = (a.p + *len) - 1;
	a.valid = 0;

	lwsws_align(&a);
	info->plugin_dirs = (void *)a.p;
	a.plugin_dirs = (void *)a.p; /* writeable version */
	a.p += MAX_PLUGIN_DIRS * sizeof(void *);

	/* copy any default paths */

	while (old && *old) {
		a.plugin_dirs[a.count_plugin_dirs++] = *old;
		old++;
	}

	lws_snprintf(dd, sizeof(dd) - 1, "%s/conf", d);
	if (lwsws_get_config(&a, dd, paths_global,
			     LWS_ARRAY_SIZE(paths_global), lejp_globals_cb) > 1)
		return 1;
	lws_snprintf(dd, sizeof(dd) - 1, "%s/conf.d", d);

	da.user = &a;
	da.paths = paths_global;
	da.count_paths = LWS_ARRAY_SIZE(paths_global),
	da.cb = lejp_globals_cb;

	if (lws_dir(dd, &da, lwsws_get_config_d_cb) > 1)
		return 1;

	a.plugin_dirs[a.count_plugin_dirs] = NULL;

	*cs = a.p;
	*len = lws_ptr_diff(a.end, a.p);

	return 0;
}